

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::Scaler::_InternalParse(Scaler *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  RepeatedField<double> *object;
  uint32_t tag;
  double *local_50;
  uint local_44;
  Scaler *local_40;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = (double *)ptr;
  local_40 = this;
LAB_0024c5a2:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_50);
    if (bVar1) {
      return (char *)local_50;
    }
    local_50 = (double *)google::protobuf::internal::ReadTag((char *)local_50,&local_44,0);
    tag_00 = local_44;
    if (local_44 >> 3 == 2) {
      object = &this->scalevalue_;
      if ((char)local_44 != '\x12') {
        if ((local_44 & 0xff) != 0x11) goto LAB_0024c63e;
        _internal_add_scalevalue(local_40,*local_50);
        local_50 = local_50 + 1;
        goto LAB_0024c5a2;
      }
LAB_0024c5f0:
      local_50 = (double *)
                 google::protobuf::internal::PackedDoubleParser(object,(char *)local_50,ctx);
    }
    else {
      if (local_44 >> 3 == 1) {
        object = &this->shiftvalue_;
        if ((char)local_44 == '\n') goto LAB_0024c5f0;
        if ((local_44 & 0xff) == 9) {
          _internal_add_shiftvalue(local_40,*local_50);
          local_50 = local_50 + 1;
          goto LAB_0024c5a2;
        }
      }
LAB_0024c63e:
      if ((local_44 == 0) || ((local_44 & 7) == 4)) {
        if (local_50 == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
        return (char *)local_50;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_50 = (double *)
                 google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_50,ctx);
    }
    if (local_50 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Scaler::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated double shiftValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_shiftvalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 9) {
          _internal_add_shiftvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // repeated double scaleValue = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_scalevalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 17) {
          _internal_add_scalevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}